

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

wchar_t scan_distant_floor(object **items,wchar_t max_size,player *p,loc_conflict grid)

{
  _Bool _Var1;
  wchar_t local_3c;
  object *poStack_38;
  wchar_t num;
  object *obj;
  player *p_local;
  wchar_t max_size_local;
  object **items_local;
  loc_conflict grid_local;
  
  local_3c = L'\0';
  _Var1 = square_in_bounds((chunk *)p->cave,grid);
  if (_Var1) {
    poStack_38 = square_object((chunk *)p->cave,grid);
    while ((poStack_38 != (object *)0x0 && (local_3c < max_size))) {
      if ((poStack_38->kind != unknown_item_kind) &&
         (_Var1 = ignore_known_item_ok(p,poStack_38), !_Var1)) {
        items[local_3c] = cave->objects[poStack_38->oidx];
        local_3c = local_3c + L'\x01';
      }
      poStack_38 = poStack_38->next;
    }
    grid_local.x = local_3c;
  }
  else {
    grid_local.x = L'\0';
  }
  return grid_local.x;
}

Assistant:

int scan_distant_floor(struct object **items, int max_size, struct player *p,
		struct loc grid)
{
	struct object *obj;
	int num = 0;

	/* Sanity */
	if (!square_in_bounds(p->cave, grid)) return 0;

	/* Scan all objects in the grid */
	for (obj = square_object(p->cave, grid); obj; obj = obj->next) {
		/* Enforce limit */
		if (num >= max_size) break;

		/* Known */
		if (obj->kind == unknown_item_kind) continue;

		/* Visible */
		if (ignore_known_item_ok(p, obj)) continue;

		/* Accept this item's base object */
		items[num++] = cave->objects[obj->oidx];
	}

	return num;
}